

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Map(Map *this,Map *map)

{
  pointer ppEVar1;
  Entity *pEVar2;
  Entity *pEVar3;
  undefined1 uVar4;
  uint16_t uVar5;
  undefined4 uVar6;
  uint8_t uVar7;
  Position PVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  Entity *pEVar18;
  pointer ppEVar19;
  Entity *local_38;
  
  this->_id = map->_id;
  this->_layout = map->_layout;
  this->_blockset = map->_blockset;
  this->_palette = map->_palette;
  this->_room_height = map->_room_height;
  this->_background_music = map->_background_music;
  this->_unknown_param_1 = map->_unknown_param_1;
  this->_unknown_param_2 = map->_unknown_param_2;
  this->_base_chest_id = map->_base_chest_id;
  this->_fall_destination = map->_fall_destination;
  this->_climb_destination = map->_climb_destination;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Rb_tree<Map_*,_std::pair<Map_*const,_Flag>,_std::_Select1st<std::pair<Map_*const,_Flag>_>,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
  ::_Rb_tree(&(this->_variants)._M_t,&(map->_variants)._M_t);
  this->_parent_map = map->_parent_map;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::vector
            (&this->_global_entity_mask_flags,&map->_global_entity_mask_flags);
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_visited_flag)._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  (this->_visited_flag).byte = 0;
  (this->_visited_flag).bit = '\0';
  this->_map_setup_addr = 0xffffffff;
  this->_map_update_addr = 0xffffffff;
  ppEVar19 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar1 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar19 != ppEVar1) {
    do {
      pEVar2 = *ppEVar19;
      pEVar18 = (Entity *)operator_new(0x58);
      uVar7 = (pEVar2->_attrs).type_id;
      PVar8 = (pEVar2->_attrs).position;
      uVar9 = (pEVar2->_attrs).orientation;
      uVar10 = (pEVar2->_attrs).palette;
      uVar11 = (pEVar2->_attrs).speed;
      bVar12 = (pEVar2->_attrs).fightable;
      bVar13 = (pEVar2->_attrs).liftable;
      bVar14 = (pEVar2->_attrs).can_pass_through;
      bVar15 = (pEVar2->_attrs).appear_after_player_moved_away;
      bVar16 = (pEVar2->_attrs).gravity_immune;
      bVar17 = (pEVar2->_attrs).talkable;
      uVar4 = (pEVar2->_attrs).field_0x11;
      uVar5 = (pEVar2->_attrs).behavior_id;
      uVar6 = *(undefined4 *)&(pEVar2->_attrs).field_0x14;
      pEVar3 = (pEVar2->_attrs).entity_to_use_tiles_from;
      (pEVar18->_attrs).dialogue = (pEVar2->_attrs).dialogue;
      (pEVar18->_attrs).field_0x11 = uVar4;
      (pEVar18->_attrs).behavior_id = uVar5;
      *(undefined4 *)&(pEVar18->_attrs).field_0x14 = uVar6;
      (pEVar18->_attrs).entity_to_use_tiles_from = pEVar3;
      (pEVar18->_attrs).type_id = uVar7;
      (pEVar18->_attrs).position = PVar8;
      (pEVar18->_attrs).orientation = uVar9;
      (pEVar18->_attrs).palette = uVar10;
      (pEVar18->_attrs).speed = uVar11;
      (pEVar18->_attrs).fightable = bVar12;
      (pEVar18->_attrs).liftable = bVar13;
      (pEVar18->_attrs).can_pass_through = bVar14;
      (pEVar18->_attrs).appear_after_player_moved_away = bVar15;
      (pEVar18->_attrs).gravity_immune = bVar16;
      (pEVar18->_attrs).talkable = bVar17;
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector
                (&(pEVar18->_attrs).mask_flags,&(pEVar2->_attrs).mask_flags);
      (pEVar18->_attrs).persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860
      ;
      (pEVar18->_attrs).persistence_flag.bit = (pEVar2->_attrs).persistence_flag.bit;
      (pEVar18->_attrs).persistence_flag.byte = (pEVar2->_attrs).persistence_flag.byte;
      bVar12 = (pEVar2->_attrs).flag_unknown_2_4;
      (pEVar18->_attrs).flag_unknown_2_3 = (pEVar2->_attrs).flag_unknown_2_3;
      (pEVar18->_attrs).flag_unknown_2_4 = bVar12;
      (pEVar18->_attrs).flag_unknown_3_5 = (pEVar2->_attrs).flag_unknown_3_5;
      pEVar18->_map = pEVar2->_map;
      pEVar18->_map = this;
      local_38 = pEVar18;
      std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*&>
                ((vector<Entity*,std::allocator<Entity*>> *)&this->_entities,&local_38);
      ppEVar19 = ppEVar19 + 1;
    } while (ppEVar19 != ppEVar1);
  }
  return;
}

Assistant:

Map::Map(const Map& map) :
    _id                         (map._id),
    _layout                     (map._layout),
    _blockset                   (map._blockset),
    _palette                    (map._palette),
    _room_height                (map._room_height),
    _background_music           (map._background_music),
    _unknown_param_1            (map._unknown_param_1),
    _unknown_param_2            (map._unknown_param_2),
    _base_chest_id              (map._base_chest_id),
    _fall_destination           (map._fall_destination),
    _climb_destination          (map._climb_destination),
    _parent_map                 (map._parent_map),
    _variants                   (map._variants),
    _global_entity_mask_flags   (map._global_entity_mask_flags)
{
    for(Entity* entity : map._entities)
        this->add_entity(new Entity(*entity));
}